

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void net_create_demon(Am_Object *self)

{
  code *pcVar1;
  Am_Value *this;
  Am_Object local_28;
  char local_19;
  code *pcStack_18;
  char c;
  Am_Object_Demon *proto_create;
  Am_Object *self_local;
  
  proto_create = (Am_Object_Demon *)self;
  this = Am_Object::Peek(self,Am_CREATE_DEMON,0);
  pcStack_18 = (code *)Am_Value::operator_cast_to_void_(this);
  if (pcStack_18 != (code *)0x0) {
    std::operator>>((istream *)&std::cin,&local_19);
    pcVar1 = pcStack_18;
    Am_Object::Am_Object(&local_28,self);
    (*pcVar1)(&local_28);
    Am_Object::~Am_Object(&local_28);
  }
  return;
}

Assistant:

void
net_create_demon(Am_Object self)
{
  Am_Object_Demon *proto_create =
      (Am_Object_Demon *)(Am_Ptr)self.Peek(Am_CREATE_DEMON);
  if (proto_create != nullptr) {
    char c;
    std::cin >> c;
    proto_create(self); // Call prototype create demon.
  }
  // Do my own code.
}